

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O2

void fe4_cswap(uint64_t *out1,uint64_t *out2,fiat_uint1 arg1,uint64_t *arg2,uint64_t *arg3)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined7 in_register_00000011;
  
  uVar9 = -(ulong)((int)CONCAT71(in_register_00000011,arg1) != 0);
  uVar1 = *arg3;
  uVar2 = arg3[1];
  uVar10 = ~uVar9;
  uVar3 = *arg2;
  uVar4 = arg2[1];
  uVar5 = arg2[2];
  uVar6 = arg3[2];
  uVar7 = arg2[3];
  uVar8 = arg3[3];
  *out1 = uVar10 & uVar3 | uVar9 & uVar1;
  out1[1] = uVar4 & uVar10 | uVar2 & uVar9;
  out1[2] = uVar5 & uVar10 | uVar6 & uVar9;
  out1[3] = uVar7 & uVar10 | uVar8 & uVar9;
  *out2 = uVar1 & uVar10 | uVar3 & uVar9;
  out2[1] = uVar2 & uVar10 | uVar4 & uVar9;
  out2[2] = uVar6 & uVar10 | uVar5 & uVar9;
  out2[3] = uVar10 & uVar8 | uVar9 & uVar7;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_cswap(uint64_t out1[4], uint64_t out2[4], fiat_uint1 arg1, const uint64_t arg2[4], const uint64_t arg3[4]) {
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  uint64_t x6;
  uint64_t x7;
  uint64_t x8;
  // NOTE: clang 14 for Zen 2 uses YMM registers
  fiat_cmovznz_u64(&x1, arg1, (arg2[0]), (arg3[0]));
  fiat_cmovznz_u64(&x2, arg1, (arg2[1]), (arg3[1]));
  fiat_cmovznz_u64(&x3, arg1, (arg2[2]), (arg3[2]));
  fiat_cmovznz_u64(&x4, arg1, (arg2[3]), (arg3[3]));
  fiat_cmovznz_u64(&x5, arg1, (arg3[0]), (arg2[0]));
  fiat_cmovznz_u64(&x6, arg1, (arg3[1]), (arg2[1]));
  fiat_cmovznz_u64(&x7, arg1, (arg3[2]), (arg2[2]));
  fiat_cmovznz_u64(&x8, arg1, (arg3[3]), (arg2[3]));
  out1[0] = x1;
  out1[1] = x2;
  out1[2] = x3;
  out1[3] = x4;
  out2[0] = x5;
  out2[1] = x6;
  out2[2] = x7;
  out2[3] = x8;
}